

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::GetMatrixTypeInfo
          (ValidationState_t *this,uint32_t id,uint32_t *num_rows,uint32_t *num_cols,
          uint32_t *column_type,uint32_t *component_type)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 in_RAX;
  const_iterator cVar5;
  uint32_t local_38;
  key_type local_34;
  
  if (id != 0) {
    _local_38 = CONCAT44((key_type)((ulong)in_RAX >> 0x20),id);
    cVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->all_definitions_)._M_h,&local_38);
    if ((cVar5.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (plVar1 = *(long **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                  ._M_cur + 0x10), plVar1 == (long *)0x0)) {
      __assert_fail("mat_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x47e,
                    "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                   );
    }
    if (*(short *)((long)plVar1 + 0x3a) == 0x18) {
      _local_38 = CONCAT44(*(undefined4 *)(*plVar1 + 8),local_38);
      cVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->all_definitions_)._M_h,&local_34);
      if ((cVar5.
           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (plVar2 = *(long **)((long)cVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                    ._M_cur + 0x10), plVar2 != (long *)0x0)) {
        if (*(short *)((long)plVar2 + 0x3a) == 0x17) {
          lVar3 = *plVar1;
          *num_cols = *(uint32_t *)(lVar3 + 0xc);
          lVar4 = *plVar2;
          *num_rows = *(uint32_t *)(lVar4 + 0xc);
          *column_type = *(uint32_t *)(lVar3 + 8);
          *component_type = *(uint32_t *)(lVar4 + 8);
          return true;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x486,
                      "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                     );
      }
      __assert_fail("vec_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x483,
                    "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                   );
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::GetMatrixTypeInfo(uint32_t id, uint32_t* num_rows,
                                          uint32_t* num_cols,
                                          uint32_t* column_type,
                                          uint32_t* component_type) const {
  if (!id) return false;

  const Instruction* mat_inst = FindDef(id);
  assert(mat_inst);
  if (mat_inst->opcode() != spv::Op::OpTypeMatrix) return false;

  const uint32_t vec_type = mat_inst->word(2);
  const Instruction* vec_inst = FindDef(vec_type);
  assert(vec_inst);

  if (vec_inst->opcode() != spv::Op::OpTypeVector) {
    assert(0);
    return false;
  }

  *num_cols = mat_inst->word(3);
  *num_rows = vec_inst->word(3);
  *column_type = mat_inst->word(2);
  *component_type = vec_inst->word(2);

  return true;
}